

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode AddFormDataf(FormData **formp,curl_off_t *size,char *fmt,...)

{
  char in_AL;
  CURLcode CVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_10f8 [24];
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined1 local_1048 [8];
  va_list ap;
  char local_1028 [8];
  char s [4096];
  char *fmt_local;
  curl_off_t *size_local;
  FormData **formp_local;
  
  if (in_AL != '\0') {
    local_10c8 = in_XMM0_Qa;
    local_10b8 = in_XMM1_Qa;
    local_10a8 = in_XMM2_Qa;
    local_1098 = in_XMM3_Qa;
    local_1088 = in_XMM4_Qa;
    local_1078 = in_XMM5_Qa;
    local_1068 = in_XMM6_Qa;
    local_1058 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_10f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_1048._4_4_ = 0x30;
  local_1048._0_4_ = 0x18;
  local_10e0 = in_RCX;
  local_10d8 = in_R8;
  local_10d0 = in_R9;
  curl_mvsnprintf(local_1028,0x1000,fmt,(__va_list_tag *)local_1048);
  CVar1 = AddFormData(formp,FORM_DATA,local_1028,0,size);
  return CVar1;
}

Assistant:

static CURLcode AddFormDataf(struct FormData **formp,
                             curl_off_t *size,
                             const char *fmt, ...)
{
  char s[4096];
  va_list ap;
  va_start(ap, fmt);
  vsnprintf(s, sizeof(s), fmt, ap);
  va_end(ap);

  return AddFormData(formp, FORM_DATA, s, 0, size);
}